

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O2

void aom_highbd_convolve8_horiz_c
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,int bd)

{
  uint16_t uVar1;
  ulong uVar2;
  long lVar3;
  int x_q4;
  uint uVar4;
  int x;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  lVar7 = (long)dst * 2;
  lVar9 = (long)src * 2 + -6;
  uVar2 = 0;
  uVar8 = (ulong)(uint)w;
  if (w < 1) {
    uVar8 = uVar2;
  }
  if (h < 1) {
    h = 0;
  }
  for (; (int)uVar2 != h; uVar2 = (ulong)((int)uVar2 + 1)) {
    uVar4 = (uint)((ulong)filter_x >> 4) & 0xf;
    for (uVar5 = 0; uVar5 != uVar8; uVar5 = uVar5 + 1) {
      iVar6 = 0;
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
        iVar6 = iVar6 + (int)*(short *)((ulong)((uVar4 & 0xf) << 4) +
                                        ((ulong)filter_x & 0xffffffffffffff00) + lVar3 * 2) *
                        (uint)*(ushort *)(lVar9 + (long)((int)uVar4 >> 4) * 2 + lVar3 * 2);
      }
      uVar1 = clip_pixel_highbd(iVar6 + 0x40 >> 7,bd);
      *(uint16_t *)(lVar7 + uVar5 * 2) = uVar1;
      uVar4 = uVar4 + x_step_q4;
    }
    lVar7 = lVar7 + dst_stride * 2;
    lVar9 = lVar9 + src_stride * 2;
  }
  return;
}

Assistant:

void aom_highbd_convolve8_horiz_c(const uint8_t *src, ptrdiff_t src_stride,
                                  uint8_t *dst, ptrdiff_t dst_stride,
                                  const int16_t *filter_x, int x_step_q4,
                                  const int16_t *filter_y, int y_step_q4, int w,
                                  int h, int bd) {
  const InterpKernel *const filters_x = get_filter_base(filter_x);
  const int x0_q4 = get_filter_offset(filter_x, filters_x);
  (void)filter_y;
  (void)y_step_q4;

  highbd_convolve_horiz(src, src_stride, dst, dst_stride, filters_x, x0_q4,
                        x_step_q4, w, h, bd);
}